

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_FSA_dns_Switch.c
# Opt level: O0

int runCVode(void *cvode_mem,N_Vector y,N_Vector *yS,UserData data)

{
  undefined8 in_RSI;
  undefined8 in_RDI;
  int retval;
  sunrealtype t;
  UserData in_stack_00000038;
  void *in_stack_00000040;
  UserData in_stack_ffffffffffffffd0;
  int local_4;
  
  PrintHeader(in_stack_ffffffffffffffd0);
  local_4 = CVode(0x4222a05f20000000,in_RDI,in_RSI,&stack0xffffffffffffffd0,1);
  if (local_4 == 0) {
    local_4 = PrintFinalStats(in_stack_00000040,in_stack_00000038);
    printf("\n");
  }
  return local_4;
}

Assistant:

static int runCVode(void* cvode_mem, N_Vector y, N_Vector* yS, UserData data)
{
  sunrealtype t;
  int retval;

  /* Print header for current run */
  PrintHeader(data);

  /* Call CVode in CV_NORMAL mode */
  retval = CVode(cvode_mem, T1, y, &t, CV_NORMAL);
  if (retval != 0) { return (retval); }

  /* Print final statistics */
  retval = PrintFinalStats(cvode_mem, data);
  printf("\n");

  return (retval);
}